

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O3

Storyboard * __thiscall
ApprovalTests::Storyboard::addDescription(Storyboard *this,string *description)

{
  ostream *poVar1;
  
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x10,(description->_M_dataplus)._M_p,
                      description->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  this->addNewLineBeforeNextFrame_ = true;
  return this;
}

Assistant:

Storyboard& Storyboard::addDescription(const std::string& description)
    {
        output_ << description << "\n";
        addNewLineBeforeNextFrame_ = true;
        return *this;
    }